

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumenter.cpp
# Opt level: O1

void __thiscall wasm::Instrumenter::addProfileExport(Instrumenter *this,size_t numFuncs)

{
  uint uVar1;
  undefined8 *puVar2;
  StorageKind SVar3;
  Module *pMVar4;
  pointer puVar5;
  Module *pMVar6;
  pointer pNVar7;
  pointer pNVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  pointer puVar11;
  pointer puVar12;
  Function *pFVar13;
  _Head_base<0UL,_wasm::Memory_*,_false> _Var14;
  ulong uVar15;
  char *pcVar16;
  undefined1 *puVar17;
  MixedArena *pMVar18;
  __uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> _Var19;
  Const *pCVar20;
  undefined1 *puVar21;
  Expression *pEVar22;
  undefined1 *puVar23;
  Expression *append;
  Expression *value;
  LocalSet *args;
  Break *args_1;
  Block *pBVar24;
  pointer pNVar25;
  pointer puVar26;
  bool bVar27;
  Type type;
  Address AVar28;
  int x;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range2;
  Name NVar29;
  Signature SVar30;
  Name NVar31;
  string_view sVar32;
  undefined1 auVar33 [16];
  Expression EVar34;
  Expression EVar35;
  string_view sVar36;
  IString IVar37;
  Name name;
  optional<wasm::Type> type_00;
  HeapType local_e8;
  Type local_e0;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  Name loadMemoryName;
  char *local_c0;
  Block *local_70;
  undefined1 (*pauStack_68) [16];
  __single_object memory;
  Function *local_50;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> writeProfile;
  Builder local_40;
  Builder builder;
  
  AVar28.addr = numFuncs * 4 + 0x10007 >> 0x10;
  pMVar4 = this->wasm;
  puVar5 = (pMVar4->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (puVar5 == (pMVar4->memories).
                super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    auVar33 = wasm::IString::interned(1,"0",0);
    pauStack_68 = (undefined1 (*) [16])operator_new(0x58);
    *(undefined8 *)pauStack_68[4] = 0;
    *(undefined8 *)(pauStack_68[4] + 8) = 0;
    *(undefined8 *)*pauStack_68 = 0;
    *(undefined8 *)((long)*pauStack_68 + 8) = 0;
    *(undefined8 *)pauStack_68[1] = 0;
    *(undefined8 *)(pauStack_68[1] + 8) = 0;
    *(undefined8 *)pauStack_68[2] = 0;
    *(undefined8 *)(pauStack_68[2] + 8) = 0;
    *(undefined8 *)pauStack_68[3] = 0;
    *(undefined8 *)(pauStack_68[3] + 8) = 0;
    *(undefined8 *)pauStack_68[4] = 0x10000;
    pauStack_68[4][8] = 0;
    *(undefined8 *)pauStack_68[5] = 2;
    *pauStack_68 = auVar33;
    *(undefined8 *)(pauStack_68[3] + 8) = 0;
    *(undefined8 *)pauStack_68[4] = 0x10000;
    pauStack_68[4][8] = 0;
    *(undefined8 *)pauStack_68[5] = 2;
    wasm::Module::addMemory((unique_ptr *)pMVar4);
    if (pauStack_68 != (undefined1 (*) [16])0x0) {
      operator_delete(pauStack_68,0x58);
    }
    _Var14._M_head_impl =
         *(Memory **)
          &(((this->wasm->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>;
    ((_Var14._M_head_impl)->initial).addr = AVar28.addr;
LAB_0011fba7:
    ((Address *)((long)_Var14._M_head_impl + 0x40))->addr = AVar28.addr;
  }
  else {
    _Var14._M_head_impl =
         (puVar5->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t
         .super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
         super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    if ((((_Var14._M_head_impl)->initial).addr < AVar28.addr) &&
       (((_Var14._M_head_impl)->initial).addr = AVar28.addr,
       ((_Var14._M_head_impl)->max).addr < AVar28.addr)) goto LAB_0011fba7;
  }
  pMVar4 = this->wasm;
  pMVar6 = *(Module **)
            ((long)(((pMVar4->memories).
                     super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                   super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t +
            0x50);
  NVar29.super_IString.str =
       (IString)wasm::IString::interned
                          ((this->config->profileExport)._M_string_length,
                           (this->config->profileExport)._M_dataplus._M_p,0);
  sVar32 = (string_view)Names::getValidFunctionName(pMVar4,NVar29);
  builder.wasm = (Module *)0x2;
  local_40.wasm = pMVar6;
  wasm::Type::Type(&local_e0,&local_40,2);
  SVar30.results.id = 2;
  SVar30.params.id = local_e0.id;
  wasm::HeapType::HeapType(&local_e8,SVar30);
  type.id = (uintptr_t)&pauStack_68;
  pauStack_68 = (undefined1 (*) [16])0x0;
  memory._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true>)
       (__uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>)0x0;
  NVar29.super_IString.str._M_str = (char *)sVar32._M_len;
  NVar29.super_IString.str._M_len = (size_t)&local_50;
  Builder::makeFunction
            (NVar29,(HeapType)sVar32._M_str,
             (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_e8.id,(Expression *)type.id);
  if (pauStack_68 != (undefined1 (*) [16])0x0) {
    operator_delete(pauStack_68,-(long)pauStack_68);
  }
  pFVar13 = local_50;
  (local_50->super_Importable).super_Named.hasExplicitName = true;
  unique0x10002493 = sVar32;
  uVar15 = wasm::IString::interned(4,"addr",0);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar15;
  wasm::Function::setLocalName((uint)pFVar13,(Name)(auVar33 << 0x40));
  pFVar13 = local_50;
  pcVar16 = (char *)wasm::IString::interned(4,"size",0);
  NVar31.super_IString.str._M_str = pcVar16;
  NVar31.super_IString.str._M_len = 1;
  wasm::Function::setLocalName((uint)pFVar13,NVar31);
  local_40.wasm = this->wasm;
  puVar17 = (undefined1 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
  *puVar17 = 8;
  *(undefined4 *)(puVar17 + 0x10) = 0;
  *(Module **)(puVar17 + 8) = pMVar6;
  pMVar18 = (MixedArena *)Builder::makeConst<long>(&local_40,this->moduleHash);
  _Var19._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
       (((this->wasm->memories).
         super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t;
  pauStack_68 = *(undefined1 (**) [16])
                 _Var19._M_t.
                 super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                 super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
  memory._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
       *(__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true> *)
        &((__uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> *)
         ((long)_Var19._M_t.
                super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8))->_M_t;
  local_70 = (Block *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x58,8);
  *(undefined8 *)&(local_70->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression = 0
  ;
  (local_70->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
  (local_70->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
       (Expression **)0x0;
  (local_70->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (local_70->name).super_IString.str._M_len = 0;
  (local_70->name).super_IString.str._M_str = (char *)0x0;
  (local_70->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  (local_70->list).allocator = (MixedArena *)0x0;
  *(undefined8 *)&local_70[1].super_SpecificExpression<(wasm::Expression::Id)1>.super_Expression = 0
  ;
  local_70[1].super_SpecificExpression<(wasm::Expression::Id)1>.super_Expression.type.id = 0;
  local_70[1].name.super_IString.str._M_len = 0;
  (local_70->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = StoreId;
  (local_70->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
  (local_70->name).super_IString.str._M_str = (char *)0x0;
  (local_70->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
       (Expression **)0x0;
  *(undefined1 *)
   &(local_70->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    usedElements = 0;
  *(undefined1 *)&(local_70->name).super_IString.str._M_len = 8;
  (local_70->name).super_IString.str._M_str = (char *)0x0;
  (local_70->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
       (Expression **)0x1;
  (local_70->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = (size_t)puVar17;
  (local_70->list).allocator = pMVar18;
  *(undefined8 *)&local_70[1].super_SpecificExpression<(wasm::Expression::Id)1>.super_Expression = 3
  ;
  local_70[1].super_SpecificExpression<(wasm::Expression::Id)1>.super_Expression.type.id =
       (uintptr_t)pauStack_68;
  local_70[1].name.super_IString.str._M_len =
       (size_t)memory._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
               _M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
               super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
  wasm::Store::finalize();
  pFVar13 = local_50;
  SVar3 = this->config->storageKind;
  uVar1 = SVar3 - InMemory;
  if (uVar1 < 2) {
    auVar33 = wasm::IString::interned(7,"funcIdx",0);
    name.super_IString.str._M_len = auVar33._8_8_;
    name.super_IString.str._M_str = (char *)0x2;
    writeProfile._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
    _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._0_4_ =
         Builder::addVar((Builder *)pFVar13,auVar33._0_8_,name,type);
    if (this->config->storageKind == InMemory) {
      _Var19._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
           (((this->wasm->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t;
    }
    else {
      _Var19._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
           (tuple<wasm::Memory_*,_std::default_delete<wasm::Memory>_>)&this->secondaryMemory;
    }
    uStack_d8 = *(undefined4 *)
                 _Var19._M_t.
                 super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                 super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    uStack_d4 = *(undefined4 *)
                 ((long)_Var19._M_t.
                        super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                        super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 4);
    loadMemoryName.super_IString.str._M_len._0_4_ =
         *(undefined4 *)
          ((long)_Var19._M_t.
                 super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                 super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
    loadMemoryName.super_IString.str._M_len._4_4_ =
         *(undefined4 *)
          ((long)_Var19._M_t.
                 super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                 super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0xc);
    sVar32 = (string_view)wasm::IString::interned(5,"outer",0);
    EVar34 = (Expression)wasm::IString::interned(1,"l",0);
    EVar35 = (Expression)wasm::IString::interned(5,"outer",0);
    puVar17 = (undefined1 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    *puVar17 = 8;
    *(Index *)(puVar17 + 0x10) =
         (Index)writeProfile._M_t.
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    *(undefined8 *)(puVar17 + 8) = 2;
    pCVar20 = Builder::makeConst<unsigned_int>(&local_40,(uint)numFuncs);
    puVar21 = (undefined1 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
    *puVar21 = 0x10;
    *(undefined8 *)(puVar21 + 8) = 0;
    *(undefined4 *)(puVar21 + 0x10) = 0xf;
    *(undefined1 **)(puVar21 + 0x18) = puVar17;
    *(Const **)(puVar21 + 0x20) = pCVar20;
    wasm::Binary::finalize();
    pEVar22 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x30,8);
    pEVar22->_id = BreakId;
    (pEVar22->type).id = 0;
    *(undefined8 *)(pEVar22 + 1) = 0;
    pEVar22[1].type.id = 0;
    *(undefined8 *)(pEVar22 + 2) = 0;
    (pEVar22->type).id = 1;
    pEVar22[1] = EVar35;
    *(undefined8 *)(pEVar22 + 2) = 0;
    pEVar22[2].type.id = (uintptr_t)puVar21;
    wasm::Break::finalize();
    puVar17 = (undefined1 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    *puVar17 = 8;
    *(undefined4 *)(puVar17 + 0x10) = 0;
    *(Module **)(puVar17 + 8) = pMVar6;
    puVar21 = (undefined1 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    *puVar21 = 8;
    *(Index *)(puVar21 + 0x10) =
         (Index)writeProfile._M_t.
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    *(undefined8 *)(puVar21 + 8) = 2;
    pCVar20 = Builder::makeConst<unsigned_int>(&local_40,4);
    puVar23 = (undefined1 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
    *puVar23 = 0x10;
    *(undefined8 *)(puVar23 + 8) = 0;
    *(undefined4 *)(puVar23 + 0x10) = 2;
    *(undefined1 **)(puVar23 + 0x18) = puVar21;
    *(Const **)(puVar23 + 0x20) = pCVar20;
    wasm::Binary::finalize();
    puVar21 = (undefined1 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
    *puVar21 = 0x10;
    *(undefined8 *)(puVar21 + 8) = 0;
    *(undefined4 *)(puVar21 + 0x10) = 0;
    *(undefined1 **)(puVar21 + 0x18) = puVar17;
    *(undefined1 **)(puVar21 + 0x20) = puVar23;
    wasm::Binary::finalize();
    puVar17 = (undefined1 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    *puVar17 = 8;
    *(Index *)(puVar17 + 0x10) =
         (Index)writeProfile._M_t.
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    *(undefined8 *)(puVar17 + 8) = 2;
    puVar23 = (undefined1 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x48,8);
    *puVar23 = 0xc;
    *(undefined8 *)(puVar23 + 0x18) = 0;
    *(undefined8 *)(puVar23 + 0x20) = 0;
    puVar23[0x28] = 0;
    *(undefined2 *)(puVar23 + 0x10) = 1;
    *(undefined8 *)(puVar23 + 0x18) = 0;
    *(undefined8 *)(puVar23 + 0x20) = 1;
    *(undefined1 **)(puVar23 + 0x30) = puVar17;
    *(undefined8 *)(puVar23 + 8) = 2;
    *(ulong *)(puVar23 + 0x38) = CONCAT44(uStack_d4,uStack_d8);
    *(ulong *)(puVar23 + 0x40) =
         CONCAT44(loadMemoryName.super_IString.str._M_len._4_4_,
                  (undefined4)loadMemoryName.super_IString.str._M_len);
    wasm::Load::finalize();
    puVar23[0x28] = 1;
    _Var19._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (((this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t;
    pauStack_68 = *(undefined1 (**) [16])
                   _Var19._M_t.
                   super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                   super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    memory._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         *(__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true> *)
          &((__uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> *)
           ((long)_Var19._M_t.
                  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8))->_M_t;
    append = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x58,8);
    *(undefined8 *)append = 0;
    (append->type).id = 0;
    *(undefined8 *)(append + 2) = 0;
    append[2].type.id = 0;
    *(undefined8 *)(append + 1) = 0;
    append[1].type.id = 0;
    *(undefined8 *)(append + 3) = 0;
    append[3].type.id = 0;
    *(undefined8 *)(append + 4) = 0;
    append[4].type.id = 0;
    *(undefined8 *)(append + 5) = 0;
    append->_id = StoreId;
    (append->type).id = 0;
    append[1].type.id = 0;
    *(undefined8 *)(append + 2) = 0;
    *(undefined1 *)&append[2].type.id = 0;
    append[1]._id = BreakId;
    append[1].type.id = 8;
    *(undefined8 *)(append + 2) = 4;
    *(undefined1 **)(append + 3) = puVar21;
    append[3].type.id = (uintptr_t)puVar23;
    *(undefined8 *)(append + 4) = 2;
    append[4].type.id = (uintptr_t)pauStack_68;
    *(__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true> *)(append + 5) =
         memory._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
         super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    wasm::Store::finalize();
    puVar17 = (undefined1 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    *puVar17 = 8;
    *(Index *)(puVar17 + 0x10) =
         (Index)writeProfile._M_t.
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    *(undefined8 *)(puVar17 + 8) = 2;
    pCVar20 = Builder::makeConst<unsigned_int>(&local_40,1);
    value = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
    value->_id = BinaryId;
    (value->type).id = 0;
    *(undefined4 *)(value + 1) = 0;
    value[1].type.id = (uintptr_t)puVar17;
    *(Const **)(value + 2) = pCVar20;
    wasm::Binary::finalize();
    args = Builder::makeLocalSet
                     (&local_40,
                      (Index)writeProfile._M_t.
                             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                             .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,value);
    sVar36 = (string_view)wasm::IString::interned(1,"l",0);
    args_1 = (Break *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x30,8);
    (args_1->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id = BreakId;
    (args_1->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 0;
    (args_1->name).super_IString.str._M_len = 0;
    (args_1->name).super_IString.str._M_str = (char *)0x0;
    args_1->value = (Expression *)0x0;
    args_1->condition = (Expression *)0x0;
    (args_1->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 1;
    (args_1->name).super_IString.str = sVar36;
    args_1->value = (Expression *)0x0;
    args_1->condition = (Expression *)0x0;
    wasm::Break::finalize();
    pBVar24 = Builder::blockify<wasm::LocalSet*,wasm::Break*>(&local_40,pEVar22,append,args,args_1);
    pEVar22 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
    pEVar22->_id = LoopId;
    (pEVar22->type).id = 0;
    *(undefined8 *)(pEVar22 + 1) = 0;
    pEVar22[1] = EVar34;
    *(Block **)(pEVar22 + 2) = pBVar24;
    wasm::Loop::finalize(pEVar22);
    pBVar24 = Builder::makeBlock(&local_40,pEVar22);
    (pBVar24->name).super_IString.str = sVar32;
    pNVar25 = (pointer)0x0;
    wasm::Block::finalize(pBVar24);
    local_70 = Builder::blockify(&local_40,(Expression *)local_70,(Expression *)pBVar24);
  }
  else {
    pNVar25 = (pointer)(ulong)uVar1;
    if (SVar3 == InGlobals) {
      pNVar7 = (this->functionGlobals).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pNVar8 = (this->functionGlobals).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pNVar25 = pNVar8;
      if (pNVar7 != pNVar8) {
        writeProfile._M_t.
        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
        super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
             (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
             (__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>)0x0;
        do {
          puVar17 = (undefined1 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
          puVar2 = (undefined8 *)
                   ((long)&(pNVar7->super_IString).str._M_len +
                   (long)writeProfile._M_t.
                         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                         .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl * 4);
          *puVar17 = 8;
          *(undefined4 *)(puVar17 + 0x10) = 0;
          *(Module **)(puVar17 + 8) = pMVar6;
          uVar9 = *puVar2;
          uVar10 = puVar2[1];
          puVar21 = (undefined1 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x20,8);
          *puVar21 = 10;
          *(undefined8 *)(puVar21 + 8) = 0;
          *(undefined8 *)(puVar21 + 0x10) = 0;
          *(undefined8 *)(puVar21 + 0x10) = uVar9;
          *(undefined8 *)(puVar21 + 0x18) = uVar10;
          *(undefined8 *)(puVar21 + 8) = 2;
          _Var19._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
               (((this->wasm->memories).
                 super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
               super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t;
          pauStack_68 = *(undefined1 (**) [16])
                         _Var19._M_t.
                         super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                         super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
          memory._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
          super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
               *(__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true> *)
                &((__uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> *)
                 ((long)_Var19._M_t.
                        super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                        super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8))->_M_t;
          pEVar22 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x58,8);
          *(undefined8 *)pEVar22 = 0;
          (pEVar22->type).id = 0;
          *(undefined8 *)(pEVar22 + 2) = 0;
          pEVar22[2].type.id = 0;
          *(undefined8 *)(pEVar22 + 1) = 0;
          pEVar22[1].type.id = 0;
          *(undefined8 *)(pEVar22 + 3) = 0;
          pEVar22[3].type.id = 0;
          *(undefined8 *)(pEVar22 + 4) = 0;
          pEVar22[4].type.id = 0;
          pNVar25 = (pointer)0x0;
          *(undefined8 *)(pEVar22 + 5) = 0;
          pEVar22->_id = StoreId;
          (pEVar22->type).id = 0;
          pEVar22[1].type.id = 0;
          *(undefined8 *)(pEVar22 + 2) = 0;
          *(undefined1 *)&pEVar22[2].type.id = 0;
          pEVar22[1]._id = BreakId;
          pEVar22[1].type.id =
               (ulong)((int)writeProfile._M_t.
                            super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                            .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 8);
          *(undefined8 *)(pEVar22 + 2) = 1;
          *(undefined1 **)(pEVar22 + 3) = puVar17;
          pEVar22[3].type.id = (uintptr_t)puVar21;
          *(undefined8 *)(pEVar22 + 4) = 2;
          pEVar22[4].type.id = (uintptr_t)pauStack_68;
          *(__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true> *)
           (pEVar22 + 5) =
               memory._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
               _M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
               super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
          wasm::Store::finalize();
          local_70 = Builder::blockify(&local_40,(Expression *)local_70,pEVar22);
          writeProfile._M_t.
          super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
          super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
          super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
               (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
               ((long)writeProfile._M_t.
                      super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                      .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 4);
        } while ((pointer)(puVar2 + 2) != pNVar8);
      }
    }
  }
  puVar17 = (undefined1 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
  *puVar17 = 8;
  *(undefined4 *)(puVar17 + 0x10) = 1;
  *(undefined8 *)(puVar17 + 8) = 2;
  x = (int)(numFuncs << 2) + 8;
  pCVar20 = Builder::makeConst<int>(&local_40,x);
  puVar21 = (undefined1 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
  *puVar21 = 0x10;
  *(undefined8 *)(puVar21 + 8) = 0;
  *(undefined4 *)(puVar21 + 0x10) = 0x18;
  *(undefined1 **)(puVar21 + 0x18) = puVar17;
  *(Const **)(puVar21 + 0x20) = pCVar20;
  wasm::Binary::finalize();
  pEVar22 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
  pEVar22->_id = IfId;
  (pEVar22->type).id = 0;
  *(undefined8 *)(pEVar22 + 2) = 0;
  *(undefined1 **)(pEVar22 + 1) = puVar21;
  pEVar22[1].type.id = (uintptr_t)local_70;
  wasm::If::finalize(pEVar22);
  pCVar20 = Builder::makeConst<int>(&local_40,x);
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pNVar25;
  pBVar24 = Builder::makeSequence(&local_40,pEVar22,(Expression *)pCVar20,type_00);
  local_50->body = (Expression *)pBVar24;
  wasm::Module::addFunction((unique_ptr *)this->wasm);
  pMVar4 = this->wasm;
  auVar33 = wasm::IString::interned
                      ((this->config->profileExport)._M_string_length,
                       (this->config->profileExport)._M_dataplus._M_p,0);
  pauStack_68 = (undefined1 (*) [16])operator_new(0x30);
  *(char **)(pauStack_68[1] + 8) = loadMemoryName.super_IString.str._M_str;
  *(char **)pauStack_68[2] = local_c0;
  *pauStack_68 = auVar33;
  *(undefined4 *)pauStack_68[1] = 0;
  pauStack_68[2][8] = 0;
  wasm::Module::addExport((unique_ptr *)pMVar4);
  if (pauStack_68 != (undefined1 (*) [16])0x0) {
    operator_delete(pauStack_68,0x30);
  }
  pMVar4 = this->wasm;
  if (*(long *)((long)(((pMVar4->memories).
                        super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                      super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> + 0x20
               ) == 0) {
    puVar11 = (pMVar4->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar12 = (pMVar4->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar11 != puVar12) {
      do {
        puVar26 = puVar11 + 1;
        bVar27 = false;
        if (((puVar11->_M_t).super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
             ._M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
             super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)->kind == Memory) {
          bVar27 = true;
          break;
        }
        puVar11 = puVar26;
      } while (puVar26 != puVar12);
      if (bVar27) goto LAB_00120679;
    }
    auVar33 = wasm::IString::interned(0xe,"profile-memory",0);
    IVar37.str = (string_view)
                 Names::getValidExportName
                           (this->wasm,
                            (IString)*(IString *)
                                      (((this->wasm->memories).
                                        super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                      super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                                      ._M_t);
    pauStack_68 = (undefined1 (*) [16])operator_new(0x30);
    ((IString *)(pauStack_68[1] + 8))->str = IVar37.str;
    *pauStack_68 = auVar33;
    *(undefined4 *)pauStack_68[1] = 2;
    pauStack_68[2][8] = 0;
    wasm::Module::addExport((unique_ptr *)pMVar4);
    if (pauStack_68 != (undefined1 (*) [16])0x0) {
      operator_delete(pauStack_68,0x30);
    }
  }
LAB_00120679:
  if (local_50 != (Function *)0x0) {
    std::default_delete<wasm::Function>::operator()
              ((default_delete<wasm::Function> *)&local_50,local_50);
  }
  return;
}

Assistant:

void Instrumenter::addProfileExport(size_t numFuncs) {
  // Calculate the size of the profile:
  //   8 bytes module hash +
  //   4 bytes for the timestamp for each function
  const size_t profileSize = 8 + 4 * numFuncs;

  // Make sure there is a memory with enough pages to write into
  size_t pages = (profileSize + Memory::kPageSize - 1) / Memory::kPageSize;
  if (wasm->memories.empty()) {
    wasm->addMemory(Builder::makeMemory("0"));
    wasm->memories[0]->initial = pages;
    wasm->memories[0]->max = pages;
  } else if (wasm->memories[0]->initial < pages) {
    wasm->memories[0]->initial = pages;
    if (wasm->memories[0]->max < pages) {
      wasm->memories[0]->max = pages;
    }
  }

  auto ptrType = wasm->memories[0]->addressType;

  // Create and export a function to dump the profile into a given memory
  // buffer. The function takes the available address and buffer size as
  // arguments and returns the total size of the profile. It only actually
  // writes the profile if the given space is sufficient to hold it.
  auto name = Names::getValidFunctionName(*wasm, config.profileExport);
  auto writeProfile =
    Builder::makeFunction(name, Signature({ptrType, Type::i32}, Type::i32), {});
  writeProfile->hasExplicitName = true;
  writeProfile->setLocalName(0, "addr");
  writeProfile->setLocalName(1, "size");

  // Create the function body
  Builder builder(*wasm);
  auto getAddr = [&]() { return builder.makeLocalGet(0, ptrType); };
  auto getSize = [&]() { return builder.makeLocalGet(1, Type::i32); };
  auto hashConst = [&]() { return builder.makeConst(int64_t(moduleHash)); };
  auto profileSizeConst = [&]() {
    return builder.makeConst(int32_t(profileSize));
  };

  // Write the hash followed by all the time stamps
  Expression* writeData = builder.makeStore(
    8, 0, 1, getAddr(), hashConst(), Type::i64, wasm->memories[0]->name);
  uint32_t offset = 8;

  switch (config.storageKind) {
    case WasmSplitOptions::StorageKind::InGlobals: {
      for (const auto& global : functionGlobals) {
        writeData = builder.blockify(
          writeData,
          builder.makeStore(4,
                            offset,
                            1,
                            getAddr(),
                            builder.makeGlobalGet(global, Type::i32),
                            Type::i32,
                            wasm->memories[0]->name));
        offset += 4;
      }
      break;
    }
    case WasmSplitOptions::StorageKind::InMemory:
    case WasmSplitOptions::StorageKind::InSecondaryMemory: {
      Index funcIdxVar =
        Builder::addVar(writeProfile.get(), "funcIdx", Type::i32);
      auto getFuncIdx = [&]() {
        return builder.makeLocalGet(funcIdxVar, Type::i32);
      };
      Name loadMemoryName =
        config.storageKind == WasmSplitOptions::StorageKind::InMemory
          ? wasm->memories[0]->name
          : secondaryMemory;
      // (block $outer
      //   (loop $l
      //     (br_if $outer (i32.eq (local.get $fucIdx) (i32.const numFuncs))
      //     (i32.store offset=8
      //       (i32.add
      //         (local.get $addr)
      //         (i32.mul (local.get $funcIdx) (i32.const 4))
      //       )
      //       (i32.atomic.load8_u (local.get $funcIdx))
      //     )
      //     (local.set $funcIdx
      //      (i32.add (local.get $fundIdx) (i32.const 1)
      //     )
      //     (br $l)
      //   )
      // )
      writeData = builder.blockify(
        writeData,
        builder.makeBlock(
          "outer",
          builder.makeLoop(
            "l",
            builder.blockify(
              builder.makeBreak(
                "outer",
                nullptr,
                builder.makeBinary(EqInt32,
                                   getFuncIdx(),
                                   builder.makeConst(uint32_t(numFuncs)))),
              builder.makeStore(
                4,
                offset,
                4,
                builder.makeBinary(
                  AddInt32,
                  getAddr(),
                  builder.makeBinary(
                    MulInt32, getFuncIdx(), builder.makeConst(uint32_t(4)))),
                builder.makeAtomicLoad(
                  1, 0, getFuncIdx(), Type::i32, loadMemoryName),
                Type::i32,
                wasm->memories[0]->name),
              builder.makeLocalSet(
                funcIdxVar,
                builder.makeBinary(
                  AddInt32, getFuncIdx(), builder.makeConst(uint32_t(1)))),
              builder.makeBreak("l")))));
      break;
    }
  }

  writeProfile->body = builder.makeSequence(
    builder.makeIf(builder.makeBinary(GeUInt32, getSize(), profileSizeConst()),
                   writeData),
    profileSizeConst());

  // Create an export for the function
  wasm->addFunction(std::move(writeProfile));
  wasm->addExport(
    Builder::makeExport(config.profileExport, name, ExternalKind::Function));

  // Export the memory if it is not already exported or imported.
  if (!wasm->memories[0]->imported()) {
    bool memoryExported = false;
    for (auto& ex : wasm->exports) {
      if (ex->kind == ExternalKind::Memory) {
        memoryExported = true;
        break;
      }
    }
    if (!memoryExported) {
      wasm->addExport(Builder::makeExport(
        "profile-memory",
        Names::getValidExportName(*wasm, wasm->memories[0]->name),
        ExternalKind::Memory));
    }
  }
}